

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::LinTickIterator::GetNextTick
          (LinTickIterator *this,float *outTick,bool *outIsMajorTick,string *outFormatString)

{
  float fVar1;
  AxisSetup *pAVar2;
  bool bVar3;
  
  pAVar2 = (this->super_TickIterator).mAxisSetup;
  if (pAVar2 == (AxisSetup *)0x0) {
    return false;
  }
  fVar1 = this->mCurrentTick;
  bVar3 = fVar1 <= pAVar2->mMax * 1.0001;
  if (bVar3) {
    *outTick = fVar1;
    *outIsMajorTick = this->mCount % (long)(pAVar2->mTickInfo).mTickDivision == 0;
    std::__cxx11::string::_M_assign((string *)outFormatString);
    this->mCurrentTick = this->mDelta + this->mCurrentTick;
    this->mCount = this->mCount + 1;
  }
  return bVar3;
}

Assistant:

bool LinTickIterator::GetNextTick (float &outTick, bool &outIsMajorTick, string &outFormatString) {
      if (!mAxisSetup) {
        return false;
      }
      if (mCurrentTick>mAxisSetup->mMax*kLittleIncrease) {
        return false;
      }
      outTick = mCurrentTick;
      outIsMajorTick = (mCount%mAxisSetup->mTickInfo.mTickDivision == 0);
      outFormatString = mFormatString;

      mCurrentTick += mDelta;
      mCount++;
      return true;
    }